

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_GetElementI_UInt32
              (Var instance,uint32 index,ScriptContext *scriptContext)

{
  Var pvVar1;
  ScriptContext *scriptContext_local;
  uint32 index_local;
  Var instance_local;
  
  pvVar1 = JavascriptNumber::ToVar(index,scriptContext);
  pvVar1 = OP_GetElementI_JIT(instance,pvVar1,scriptContext);
  return pvVar1;
}

Assistant:

Var JavascriptOperators::OP_GetElementI_UInt32(Var instance, uint32 index, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_GetElementI_UInt32);
#if FLOATVAR
        return OP_GetElementI_JIT(instance, Js::JavascriptNumber::ToVar(index, scriptContext), scriptContext);
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return OP_GetElementI_JIT(instance, Js::JavascriptNumber::ToVarInPlace(index, scriptContext,
            (Js::JavascriptNumber *)buffer), scriptContext);
#endif
        JIT_HELPER_END(Op_GetElementI_UInt32);
    }